

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintToChar<wchar_t>(wchar_t value,iu_ostream *os)

{
  char cVar1;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  size_t sVar16;
  ostream *poVar17;
  int in_ECX;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  short sVar23;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  wchar_t str [2];
  string local_58;
  ulong local_38;
  undefined1 local_30;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  uint uVar22;
  undefined4 uVar24;
  undefined6 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar31 [16];
  
  if (value == L'\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    return;
  }
  if (value < L' ') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
    uVar20 = (uint)value >> 0x1c;
    uVar18 = (uint)value >> 0xc & 0xf;
    uVar19 = (uint)value >> 8 & 0xf;
    auVar30._0_8_ = CONCAT44((uint)value >> 8,(uint)value >> 0xc) & 0xf0000000f;
    auVar30._8_4_ = (uint)value >> 4 & 0xf;
    auVar30._12_4_ = value & 0xf;
    uVar22 = (uint)value >> 0x18 & 0xf;
    auVar21._0_8_ = CONCAT44((uint)value >> 0x18,uVar20) & 0xf0000000f;
    auVar21._8_4_ = (uint)value >> 0x14 & 0xf;
    auVar21._12_4_ = (uint)value >> 0x10 & 0xf;
    auVar29._0_4_ = -(uint)(9 < uVar20);
    auVar29._4_4_ = -(uint)(9 < uVar22);
    auVar29._8_4_ = -(uint)(9 < auVar21._8_4_);
    auVar29._12_4_ = -(uint)(9 < auVar21._12_4_);
    auVar32._0_4_ = -(uint)(9 < uVar18);
    auVar32._4_4_ = -(uint)(9 < uVar19);
    auVar32._8_4_ = -(uint)(9 < auVar30._8_4_);
    auVar32._12_4_ = -(uint)(9 < auVar30._12_4_);
    auVar34._0_4_ = uVar20 + 0x37;
    auVar34._4_4_ = uVar22 + 0x37;
    auVar34._8_4_ = auVar21._8_4_ + 0x37;
    auVar34._12_4_ = auVar21._12_4_ + 0x37;
    auVar33._0_4_ = uVar18 + 0x37;
    auVar33._4_4_ = uVar19 + 0x37;
    auVar33._8_4_ = auVar30._8_4_ + 0x37;
    auVar33._12_4_ = auVar30._12_4_ + 0x37;
    auVar33 = ~auVar32 & (auVar30 | _DAT_0014c080) | auVar33 & auVar32;
    auVar30 = ~auVar29 & (auVar21 | _DAT_0014c080) | auVar34 & auVar29;
    sVar9 = auVar30._0_2_;
    cVar1 = (0 < sVar9) * (sVar9 < 0x100) * auVar30[0] - (0xff < sVar9);
    sVar9 = auVar30._2_2_;
    sVar23 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar30[2] - (0xff < sVar9),cVar1);
    sVar9 = auVar30._4_2_;
    cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar30[4] - (0xff < sVar9);
    sVar9 = auVar30._6_2_;
    uVar24 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                      CONCAT12(cVar2,sVar23));
    sVar9 = auVar30._8_2_;
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar30[8] - (0xff < sVar9);
    sVar9 = auVar30._10_2_;
    uVar25 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar30[10] - (0xff < sVar9),
                      CONCAT14(cVar3,uVar24));
    sVar9 = auVar30._12_2_;
    cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar30[0xc] - (0xff < sVar9);
    sVar9 = auVar30._14_2_;
    uVar26 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar30[0xe] - (0xff < sVar9),
                      CONCAT16(cVar4,uVar25));
    sVar9 = auVar33._0_2_;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar33[0] - (0xff < sVar9);
    sVar9 = auVar33._2_2_;
    auVar27._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar33[2] - (0xff < sVar9),CONCAT18(cVar5,uVar26)
                 );
    sVar9 = auVar33._4_2_;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar33[4] - (0xff < sVar9);
    auVar27[10] = cVar6;
    sVar9 = auVar33._6_2_;
    auVar27[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[6] - (0xff < sVar9);
    sVar9 = auVar33._8_2_;
    cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar33[8] - (0xff < sVar9);
    auVar28[0xc] = cVar7;
    auVar28._0_12_ = auVar27;
    sVar9 = auVar33._10_2_;
    auVar28[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[10] - (0xff < sVar9);
    sVar9 = auVar33._12_2_;
    cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar33[0xc] - (0xff < sVar9);
    auVar31[0xe] = cVar8;
    auVar31._0_14_ = auVar28;
    sVar9 = auVar33._14_2_;
    auVar31[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[0xe] - (0xff < sVar9);
    sVar9 = (short)((uint)uVar24 >> 0x10);
    sVar10 = (short)((uint6)uVar25 >> 0x20);
    sVar11 = (short)((ulong)uVar26 >> 0x30);
    sVar12 = (short)((unkuint10)auVar27._0_10_ >> 0x40);
    sVar13 = auVar27._10_2_;
    sVar14 = auVar28._12_2_;
    sVar15 = auVar31._14_2_;
    local_38 = CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                        CONCAT16((0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14),
                                 CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13),
                                          CONCAT14((0 < sVar12) * (sVar12 < 0x100) * cVar5 -
                                                   (0xff < sVar12),
                                                   CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar4
                                                            - (0xff < sVar11),
                                                            CONCAT12((0 < sVar10) * (sVar10 < 0x100)
                                                                     * cVar3 - (0xff < sVar10),
                                                                     CONCAT11((0 < sVar9) *
                                                                              (sVar9 < 0x100) *
                                                                              cVar2 - (0xff < sVar9)
                                                                              ,(0 < sVar23) *
                                                                               (sVar23 < 0x100) *
                                                                               cVar1 - (0xff < 
                                                  sVar23))))))));
    local_30 = 0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    sVar16 = strlen((char *)&local_38);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,&local_38,(long)&local_38 + sVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  else {
    local_38 = (ulong)(uint)value;
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    AnyStringToMultiByteString_abi_cxx11_
              (&local_58,(detail *)&local_38,(wchar_t *)0xffffffff,in_ECX);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}